

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void mp::
     WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,std::array<int,3ul>,std::array<double,3ul>,mp::ExponentialConeId>
               (MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *jw,
               CustomStaticConstraint<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>
               *cfc)

{
  long in_RSI;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_RDI;
  array<int,_3UL> *in_stack_ffffffffffffff88;
  array<double,_3UL> *o;
  char *in_stack_ffffffffffffff98;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  array<double,_3UL> local_50;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffffc8;
  string_view in_stack_ffffffffffffffd0;
  char local_20 [16];
  long local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  __str = local_20;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
  CustomConstraintData<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>::
  GetArguments((CustomConstraintData<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>
                *)(local_10 + 0x20));
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,std::array<int,3ul>>
            (in_RDI,in_stack_ffffffffffffff88);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x43f539);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffa0,__str);
  o = &local_50;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
  CustomConstraintData<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>::
  GetParameters((CustomConstraintData<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>
                 *)(local_10 + 0x20));
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,std::array<double,3ul>>
            (in_RDI,o);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x43f58d);
  return;
}

Assistant:

inline void WriteJSON(JW jw,
                      const CustomStaticConstraint<A,P,I>& cfc) {
  WriteJSON(jw["args"], cfc.GetArguments());
  WriteJSON(jw["params"], cfc.GetParameters());
}